

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_rawset(lua_State *L)

{
  luaL_checktype(L,1,5);
  luaL_checkany(L,2);
  luaL_checkany(L,3);
  lua_settop(L,3);
  lua_rawset(L,1);
  return 1;
}

Assistant:

static int luaB_rawset (lua_State *L) {
  luaL_checktype(L, 1, LUA_TTABLE);
  luaL_checkany(L, 2);
  luaL_checkany(L, 3);
  lua_settop(L, 3);
  lua_rawset(L, 1);
  return 1;
}